

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<(anonymous_namespace)::logic_t_const&>::operator==
          (result *__return_storage_ptr__,
          expression_lhs<(anonymous_namespace)::logic_t_const&> *this,logic_t *rhs)

{
  int iVar1;
  int iVar2;
  ostream *poVar3;
  result *extraout_RAX;
  result *extraout_RAX_00;
  result *prVar4;
  ostringstream os;
  long *local_228;
  long local_220;
  long local_218 [2];
  result *local_208;
  long local_200;
  undefined1 local_1f8 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1e0;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  iVar1 = rhs->value;
  iVar2 = *(int *)this;
  local_228 = local_218;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_228,"==","");
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  to_string<(anonymous_namespace)::logic_t>(&local_1c8,(logic_t *)this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)local_228,local_220);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  to_string<(anonymous_namespace)::logic_t>((string *)(local_1f8 + 0x10),rhs);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(char *)local_1f8._16_8_,local_1e0._M_allocated_capacity);
  if ((char *)local_1f8._16_8_ != local_1e0._M_local_buf + 8) {
    operator_delete((void *)local_1f8._16_8_,local_1e0._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  __return_storage_ptr__->passed = iVar2 == iVar1;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_208,
             &local_208->passed + local_200);
  prVar4 = (result *)local_1f8;
  if (local_208 != prVar4) {
    operator_delete(local_208,local_1f8._0_8_ + 1);
    prVar4 = extraout_RAX;
  }
  if (local_228 != local_218) {
    operator_delete(local_228,local_218[0] + 1);
    prVar4 = extraout_RAX_00;
  }
  return prVar4;
}

Assistant:

result operator==( R const & rhs ) { return result( lhs == rhs, to_string( lhs, "==", rhs ) ); }